

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_session_init.c
# Opt level: O3

int webSocket_buildRespondShakeKey(uchar *acceptKey,uint acceptKeyLen,uchar *respondKey)

{
  int iVar1;
  char *source;
  char *__s;
  size_t sVar2;
  uchar *bindata;
  int start;
  uchar *puVar3;
  int iVar4;
  int iVar5;
  
  if (acceptKey != (uchar *)0x0) {
    source = (char *)calloc(1,(ulong)(acceptKeyLen + 0x2f));
    memcpy(source,acceptKey,(ulong)acceptKeyLen);
    builtin_strncpy(source + acceptKeyLen,"258EAFA5-E914-47DA-95CA-C5AB0DC85B11",0x25);
    source[acceptKeyLen + 0x25] = '\0';
    __s = sha1_hash(source);
    sVar2 = strlen(__s);
    iVar5 = (int)sVar2;
    iVar4 = (int)(((uint)(sVar2 >> 0x1f) & 1) + iVar5) >> 1;
    bindata = (uchar *)calloc(1,(long)(iVar4 + 1));
    if (0 < iVar5) {
      start = 0;
      puVar3 = bindata;
      do {
        iVar1 = htoi(__s,start,2);
        *puVar3 = (uchar)iVar1;
        start = start + 2;
        puVar3 = puVar3 + 1;
      } while (start < iVar5);
    }
    iVar4 = base64_encode(bindata,(char *)respondKey,iVar4);
    free(__s);
    free(bindata);
    free(source);
    return iVar4;
  }
  return 0;
}

Assistant:

int webSocket_buildRespondShakeKey(unsigned char *acceptKey, unsigned int acceptKeyLen, unsigned char *respondKey) {
    char *clientKey;
    char *sha1DataTemp;
    char *sha1Data;
    int i, n;
    const char GUID[] = "258EAFA5-E914-47DA-95CA-C5AB0DC85B11";
    unsigned int GUIDLEN;

    if(acceptKey == NULL)
        return 0;
    GUIDLEN = sizeof(GUID);
    clientKey = (char *)calloc(1, sizeof(char)*(acceptKeyLen + GUIDLEN + 10));
    memset(clientKey, 0, (acceptKeyLen + GUIDLEN + 10));
    //
    memcpy(clientKey, acceptKey, acceptKeyLen);
    memcpy(&clientKey[acceptKeyLen], GUID, GUIDLEN);
    clientKey[acceptKeyLen + GUIDLEN] = '\0';
    //
    sha1DataTemp = sha1_hash(clientKey);
    n = strlen(sha1DataTemp);
    sha1Data = (char *)calloc(1, n / 2 + 1);
    memset(sha1Data, 0, n / 2 + 1);
    //
    for(i = 0; i < n; i += 2)
        sha1Data[ i / 2 ] = htoi(sha1DataTemp, i, 2);
    n = base64_encode((const unsigned char *)sha1Data, (char *)respondKey, (n / 2));
    //
    free(sha1DataTemp);
    free(sha1Data);
    free(clientKey);
    return n;
}